

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O0

string * (anonymous_namespace)::DescriptorChecksum_abi_cxx11_(Span<const_char> *span)

{
  int iVar1;
  char *pcVar2;
  size_type sVar3;
  const_reference pvVar4;
  reference pvVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  int j_1;
  int j;
  size_type pos;
  char ch;
  char *__end1;
  char *__begin1;
  Span<const_char> *__range1;
  int clscount;
  int cls;
  uint64_t c;
  string *ret;
  Span<const_char> *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  undefined7 in_stack_ffffffffffffff48;
  value_type in_stack_ffffffffffffff4f;
  allocator<char> *in_stack_ffffffffffffff50;
  char __c;
  size_type in_stack_ffffffffffffff60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  int local_6c;
  char *local_50;
  int local_40;
  allocator<char> local_c;
  allocator<char> local_b;
  undefined1 local_a [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  if ((DescriptorChecksum[abi:cxx11](Span<char_const>const&)::INPUT_CHARSET_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&DescriptorChecksum[abi:cxx11](Span<char_const>const&)::
                                   INPUT_CHARSET_abi_cxx11_), iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),(char *)this,
               (allocator<char> *)in_RDI);
    std::allocator<char>::~allocator((allocator<char> *)(local_a + 1));
    __cxa_atexit(std::__cxx11::string::~string,
                 &DescriptorChecksum[abi:cxx11](Span<char_const>const&)::INPUT_CHARSET_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&DescriptorChecksum[abi:cxx11](Span<char_const>const&)::
                         INPUT_CHARSET_abi_cxx11_);
  }
  if ((DescriptorChecksum[abi:cxx11](Span<char_const>const&)::CHECKSUM_CHARSET_abi_cxx11_ == '\0')
     && (iVar1 = __cxa_guard_acquire(&DescriptorChecksum[abi:cxx11](Span<char_const>const&)::
                                      CHECKSUM_CHARSET_abi_cxx11_), iVar1 != 0)) {
    in_stack_ffffffffffffff68 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),(char *)this,
               (allocator<char> *)in_RDI);
    std::allocator<char>::~allocator((allocator<char> *)local_a);
    __cxa_atexit(std::__cxx11::string::~string,
                 &DescriptorChecksum[abi:cxx11](Span<char_const>const&)::CHECKSUM_CHARSET_abi_cxx11_
                 ,&__dso_handle);
    __cxa_guard_release(&DescriptorChecksum[abi:cxx11](Span<char_const>const&)::
                         CHECKSUM_CHARSET_abi_cxx11_);
  }
  local_40 = 0;
  local_50 = Span<const_char>::begin(in_stack_ffffffffffffff38);
  pcVar2 = Span<const_char>::end(in_stack_ffffffffffffff38);
  do {
    if (local_50 == pcVar2) {
      if (0 < local_40) {
        anon_unknown.dwarf_1ba5289::PolyMod
                  (CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                   in_stack_ffffffffffffff44);
      }
      for (local_6c = 0; local_6c < 8; local_6c = local_6c + 1) {
        anon_unknown.dwarf_1ba5289::PolyMod
                  (CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                   in_stack_ffffffffffffff44);
      }
      __c = (char)((ulong)&local_c >> 0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,__c,in_stack_ffffffffffffff50);
      std::allocator<char>::~allocator(&local_c);
      for (iVar1 = 0; iVar1 < 8; iVar1 = iVar1 + 1) {
        pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                            CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
        in_stack_ffffffffffffff4f = *pvVar4;
        pvVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                            CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
        *pvVar5 = in_stack_ffffffffffffff4f;
      }
LAB_00e69af8:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return this;
      }
      __stack_chk_fail();
    }
    sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      (this,(char)((uint)in_stack_ffffffffffffff8c >> 0x18),(size_type)in_RDI);
    if (sVar3 == 0xffffffffffffffff) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),(char *)this,
                 (allocator<char> *)in_RDI);
      std::allocator<char>::~allocator(&local_b);
      goto LAB_00e69af8;
    }
    anon_unknown.dwarf_1ba5289::PolyMod
              (CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
               in_stack_ffffffffffffff44);
    local_40 = local_40 + 1;
    if (local_40 == 3) {
      anon_unknown.dwarf_1ba5289::PolyMod
                (CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
                 in_stack_ffffffffffffff44);
      local_40 = 0;
    }
    local_50 = local_50 + 1;
  } while( true );
}

Assistant:

std::string DescriptorChecksum(const Span<const char>& span)
{
    /** A character set designed such that:
     *  - The most common 'unprotected' descriptor characters (hex, keypaths) are in the first group of 32.
     *  - Case errors cause an offset that's a multiple of 32.
     *  - As many alphabetic characters are in the same group (while following the above restrictions).
     *
     * If p(x) gives the position of a character c in this character set, every group of 3 characters
     * (a,b,c) is encoded as the 4 symbols (p(a) & 31, p(b) & 31, p(c) & 31, (p(a) / 32) + 3 * (p(b) / 32) + 9 * (p(c) / 32).
     * This means that changes that only affect the lower 5 bits of the position, or only the higher 2 bits, will just
     * affect a single symbol.
     *
     * As a result, within-group-of-32 errors count as 1 symbol, as do cross-group errors that don't affect
     * the position within the groups.
     */
    static const std::string INPUT_CHARSET =
        "0123456789()[],'/*abcdefgh@:$%{}"
        "IJKLMNOPQRSTUVWXYZ&+-.;<=>?!^_|~"
        "ijklmnopqrstuvwxyzABCDEFGH`#\"\\ ";

    /** The character set for the checksum itself (same as bech32). */
    static const std::string CHECKSUM_CHARSET = "qpzry9x8gf2tvdw0s3jn54khce6mua7l";

    uint64_t c = 1;
    int cls = 0;
    int clscount = 0;
    for (auto ch : span) {
        auto pos = INPUT_CHARSET.find(ch);
        if (pos == std::string::npos) return "";
        c = PolyMod(c, pos & 31); // Emit a symbol for the position inside the group, for every character.
        cls = cls * 3 + (pos >> 5); // Accumulate the group numbers
        if (++clscount == 3) {
            // Emit an extra symbol representing the group numbers, for every 3 characters.
            c = PolyMod(c, cls);
            cls = 0;
            clscount = 0;
        }
    }
    if (clscount > 0) c = PolyMod(c, cls);
    for (int j = 0; j < 8; ++j) c = PolyMod(c, 0); // Shift further to determine the checksum.
    c ^= 1; // Prevent appending zeroes from not affecting the checksum.

    std::string ret(8, ' ');
    for (int j = 0; j < 8; ++j) ret[j] = CHECKSUM_CHARSET[(c >> (5 * (7 - j))) & 31];
    return ret;
}